

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O2

char ** hts_readlist(char *string,int is_file,int *_n)

{
  int iVar1;
  uint uVar2;
  BGZF *f;
  kstream_t *ks;
  char *pcVar3;
  char **ppcVar4;
  char *__dest;
  int iVar5;
  char *__src;
  ulong uVar6;
  uint uVar7;
  void *local_78;
  int dret;
  kstring_t local_48;
  
  if (is_file == 0) {
    pcVar3 = string + 1;
    uVar7 = 0;
    local_78 = (void *)0x0;
    iVar5 = 0;
    __src = string;
    do {
      if ((pcVar3[-1] == ',') || (pcVar3[-1] == '\0')) {
        if (iVar5 <= (int)uVar7) {
          uVar2 = (int)uVar7 >> 1 | uVar7;
          uVar2 = (int)uVar2 >> 2 | uVar2;
          uVar2 = (int)uVar2 >> 4 | uVar2;
          uVar2 = (int)uVar2 >> 8 | uVar2;
          uVar2 = (int)uVar2 >> 0x10 | uVar2;
          iVar5 = uVar2 + 1;
          local_78 = realloc(local_78,(long)(int)uVar2 * 8 + 8);
        }
        uVar2 = uVar7 + 1;
        __dest = (char *)calloc(((long)string - (long)__src) + 1,1);
        *(char **)((long)local_78 + (long)(int)uVar7 * 8) = __dest;
        strncpy(__dest,__src,(long)string - (long)__src);
        __src = pcVar3;
        uVar7 = uVar2;
        if (pcVar3[-1] == '\0') goto LAB_0010a58c;
      }
      pcVar3 = pcVar3 + 1;
      string = string + 1;
    } while( true );
  }
  f = bgzf_open(string,"r");
  ppcVar4 = (char **)0x0;
  if (f != (BGZF *)0x0) {
    iVar5 = 0;
    local_48.l = 0;
    local_48.m = 0;
    local_48.s = (char *)0x0;
    ks = ks_init(f);
    local_78 = (void *)0x0;
    uVar6 = 0;
    while( true ) {
      iVar1 = ks_getuntil(ks,2,&local_48,&dret);
      uVar2 = (uint)uVar6;
      if (iVar1 < 0) break;
      if (local_48.l != 0) {
        if ((long)iVar5 <= (long)uVar6) {
          uVar2 = (uint)(uVar6 >> 1) & 0x7fffffff | uVar2;
          uVar2 = uVar2 >> 2 | uVar2;
          uVar2 = uVar2 >> 4 | uVar2;
          uVar2 = uVar2 >> 8 | uVar2;
          uVar2 = uVar2 >> 0x10 | uVar2;
          iVar5 = uVar2 + 1;
          local_78 = realloc(local_78,(long)(int)uVar2 * 8 + 8);
        }
        pcVar3 = strdup(local_48.s);
        *(char **)((long)local_78 + uVar6 * 8) = pcVar3;
        uVar6 = uVar6 + 1;
      }
    }
    ks_destroy(ks);
    bgzf_close(f);
    free(local_48.s);
LAB_0010a58c:
    ppcVar4 = (char **)realloc(local_78,(long)(int)uVar2 * 8);
    *_n = uVar2;
  }
  return ppcVar4;
}

Assistant:

char **hts_readlist(const char *string, int is_file, int *_n)
{
    int m = 0, n = 0, dret;
    char **s = 0;
    if ( is_file )
    {
#if KS_BGZF
        BGZF *fp = bgzf_open(string, "r");
#else
        gzFile fp = gzopen(string, "r");
#endif
        if ( !fp ) return NULL;

        kstream_t *ks;
        kstring_t str;
        str.s = 0; str.l = str.m = 0;
        ks = ks_init(fp);
        while (ks_getuntil(ks, KS_SEP_LINE, &str, &dret) >= 0)
        {
            if (str.l == 0) continue;
            n++;
            hts_expand(char*,n,m,s);
            s[n-1] = strdup(str.s);
        }
        ks_destroy(ks);
#if KS_BGZF
        bgzf_close(fp);
#else
        gzclose(fp);
#endif
        free(str.s);
    }
    else
    {
        const char *q = string, *p = string;
        while ( 1 )
        {
            if (*p == ',' || *p == 0)
            {
                n++;
                hts_expand(char*,n,m,s);
                s[n-1] = (char*)calloc(p - q + 1, 1);
                strncpy(s[n-1], q, p - q);
                q = p + 1;
            }
            if ( !*p ) break;
            p++;
        }
    }
    s = (char**)realloc(s, n * sizeof(char*));
    *_n = n;
    return s;
}